

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::invalidIndexRange(SelectionEvaluator *this,pair<int,_int> range)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  pair<int,_int> local_48;
  string local_40;
  
  local_48 = range;
  toString<int>(&local_40,&local_48.first);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x2cff45);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_b8 = *puVar4;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar4;
    local_c8 = (ulong *)*plVar1;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  toString<int>(&local_a8,&local_48.second);
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < local_a8._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar6 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c0 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0026f59c;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_0026f59c:
  local_e8 = &local_d8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_d8 = *plVar1;
    uStack_d0 = puVar2[3];
  }
  else {
    local_d8 = *plVar1;
    local_e8 = (long *)*puVar2;
  }
  local_e0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_58 = *plVar3;
    uStack_50 = (undefined4)plVar1[3];
    uStack_4c = *(undefined4 *)((long)plVar1 + 0x1c);
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar1;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_68);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void invalidIndexRange(std::pair<int, int> range) {
      evalError("invalid index range: [" + toString(range.first) + ", " +
                toString(range.second) + ")");
    }